

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O1

void my_canvas_properties(t_gobj *z,_glist *owner)

{
  iemgui_new_dialog(z,(t_iemgui *)z,"cnv",
                    (float)(*(int *)((long)&z[4].g_pd + 4) /
                           *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4)),1.0,0.0,0.0,
                    (float)*(int *)&z[0x4c].g_pd,(float)*(int *)((long)&z[0x4c].g_pd + 4),0,-1,"",""
                    ,0,-1,-1);
  return;
}

Assistant:

static void my_canvas_properties(t_gobj *z, t_glist *owner)
{
    t_my_canvas *x = (t_my_canvas *)z;
    iemgui_new_dialog(x, &x->x_gui, "cnv",
                      x->x_gui.x_w/IEMGUI_ZOOM(x), 1,
                      0, 0,
                      x->x_vis_w, x->x_vis_h,
                      0,
                      -1, "", "",
                      0, -1, -1);

}